

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

string_view __thiscall cinatra::http_parser::get_header_value(http_parser *this,string_view key)

{
  string_view b;
  string_view a;
  string_view sVar1;
  bool bVar2;
  const_reference pvVar3;
  array<cinatra::http_header,_100UL> *in_RSI;
  size_t in_RDI;
  size_t i;
  array<cinatra::http_header,_100UL> *in_stack_ffffffffffffffb0;
  char *pcVar4;
  size_t sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  pcVar4 = (char *)0x0;
  sVar5 = in_RDI;
  do {
    if (*(char **)(in_RDI + 0x18) <= pcVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
LAB_0027d833:
      sVar1._M_str = local_10._M_str;
      sVar1._M_len = local_10._M_len;
      return sVar1;
    }
    pvVar3 = std::array<cinatra::http_header,_100UL>::operator[](in_stack_ffffffffffffffb0,in_RDI);
    in_stack_ffffffffffffffb0 = in_RSI;
    a._M_str = (char *)in_stack_ffffffffffffffb0;
    a._M_len = sVar5;
    b._M_str = pcVar4;
    b._M_len = (size_t)(pvVar3->name)._M_str;
    in_RSI = in_stack_ffffffffffffffb0;
    bVar2 = iequal0(a,b);
    if (bVar2) {
      pvVar3 = std::array<cinatra::http_header,_100UL>::operator[](in_stack_ffffffffffffffb0,in_RDI)
      ;
      local_10._M_len = (pvVar3->value)._M_len;
      local_10._M_str = (pvVar3->value)._M_str;
      goto LAB_0027d833;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::string_view get_header_value(std::string_view key) const {
    for (size_t i = 0; i < num_headers_; i++) {
      if (iequal0(headers_[i].name, key))
        return headers_[i].value;
    }
    return {};
  }